

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

dsListEntry * dsListBegin(dsList *list)

{
  dsListEntry *entry;
  dsList *list_local;
  
  if (list->headOffset == 0xffffffffffffffff) {
    list_local = (dsList *)0x0;
  }
  else {
    list_local = (dsList *)dsPtr(list->headOffset,0x20);
    if (list_local == (dsList *)0x0) {
      dsRunLogCallback("%s(): Can\'t map list head.\n","dsListBegin");
      list_local = (dsList *)0x0;
    }
  }
  return (dsListEntry *)list_local;
}

Assistant:

dsListEntry *
dsListBegin(dsList *list)
{
	dsListEntry *entry;

	if (list->headOffset == UINT64_MAX) {
		return(NULL);
	}

	if ((entry = dsPtr(list->headOffset, sizeof(*entry))) == NULL) {
		dsLog("Can't map list head.\n");
		return(NULL);
	}

	return(entry);
}